

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brktrans.cpp
# Opt level: O3

void __thiscall
icu_63::BreakTransliterator::handleTransliterate
          (BreakTransliterator *this,Replaceable *text,UTransPosition *offsets,UBool isIncremental)

{
  UnicodeString *pUVar1;
  short sVar2;
  undefined8 uVar3;
  byte bVar4;
  UBool UVar5;
  int iVar6;
  UChar32 UVar7;
  uint uVar8;
  int iVar9;
  Locale *key;
  BreakIterator *pBVar10;
  UVector32 *this_00;
  int iVar11;
  undefined7 in_register_00000009;
  Replaceable *status_00;
  BreakTransliterator *nonConstThis;
  UErrorCode status;
  UnicodeString sText;
  undefined1 local_84 [12];
  int local_78;
  undefined4 local_74;
  UnicodeString local_70;
  
  local_84._0_4_ = U_ZERO_ERROR;
  status_00 = text;
  umtx_lock_63((UMutex *)0x0);
  pBVar10 = (this->cachedBI).super_LocalPointerBase<icu_63::BreakIterator>.ptr;
  this_00 = (this->cachedBoundaries).super_LocalPointerBase<icu_63::UVector32>.ptr;
  (this->cachedBI).super_LocalPointerBase<icu_63::BreakIterator>.ptr = (BreakIterator *)0x0;
  (this->cachedBoundaries).super_LocalPointerBase<icu_63::UVector32>.ptr = (UVector32 *)0x0;
  umtx_unlock_63((UMutex *)0x0);
  if (pBVar10 == (BreakIterator *)0x0) {
    key = Locale::getEnglish();
    status_00 = (Replaceable *)local_84;
    pBVar10 = BreakIterator::createWordInstance(key,(UErrorCode *)status_00);
  }
  if (this_00 == (UVector32 *)0x0) {
    this_00 = (UVector32 *)UMemory::operator_new((UMemory *)0x20,(size_t)status_00);
    if (this_00 == (UVector32 *)0x0) goto LAB_00293938;
    UVector32::UVector32(this_00,(UErrorCode *)local_84);
  }
  if ((pBVar10 != (BreakIterator *)0x0) && ((int)local_84._0_4_ < U_ILLEGAL_ARGUMENT_ERROR)) {
    UVector32::removeAllElements(this_00);
    replaceableAsString(&local_70,text);
    local_84._4_8_ = this;
    (*(pBVar10->super_UObject)._vptr_UObject[7])(pBVar10,&local_70);
    (*(pBVar10->super_UObject)._vptr_UObject[0x10])(pBVar10,(ulong)(uint)offsets->start);
    local_74 = (undefined4)CONCAT71(in_register_00000009,isIncremental);
    iVar6 = (*(pBVar10->super_UObject)._vptr_UObject[0xd])();
    while ((iVar9 = offsets->limit, iVar6 != -1 && (iVar6 < iVar9))) {
      if (iVar6 != 0) {
        UVar7 = icu_63::UnicodeString::char32At(&local_70,iVar6 + -1);
        bVar4 = u_charType_63(UVar7);
        if ((0x1feU >> (bVar4 & 0x1f) & 1) != 0) {
          UVar7 = icu_63::UnicodeString::char32At(&local_70,iVar6);
          bVar4 = u_charType_63(UVar7);
          if ((0x1feU >> (bVar4 & 0x1f) & 1) != 0) {
            iVar9 = this_00->count;
            if ((iVar9 < -1) || (this_00->capacity <= iVar9)) {
              UVar5 = UVector32::expandCapacity(this_00,iVar9 + 1,(UErrorCode *)local_84);
              if (UVar5 == '\0') goto LAB_0029384e;
              iVar9 = this_00->count;
            }
            this_00->elements[iVar9] = iVar6;
            this_00->count = this_00->count + 1;
          }
        }
      }
LAB_0029384e:
      iVar6 = (*(pBVar10->super_UObject)._vptr_UObject[0xd])();
    }
    uVar8 = this_00->count;
    if ((ulong)uVar8 == 0) {
      iVar11 = 0;
      iVar6 = 0;
    }
    else {
      sVar2 = (((UnicodeString *)(local_84._4_8_ + 0x68))->fUnion).fStackFields.fLengthAndFlags;
      if (sVar2 < 0) {
        local_78 = (((UnicodeString *)(local_84._4_8_ + 0x68))->fUnion).fFields.fLength;
      }
      else {
        local_78 = (int)sVar2 >> 5;
      }
      if ((int)uVar8 < 1) {
        iVar6 = 0;
      }
      else {
        iVar6 = this_00->elements[(ulong)uVar8 - 1];
      }
      pUVar1 = (UnicodeString *)(local_84._4_8_ + 0x68);
      local_78 = local_78 * uVar8;
      while (0 < this_00->count) {
        uVar8 = this_00->count - 1;
        this_00->count = uVar8;
        (*(text->super_UObject)._vptr_UObject[4])
                  (text,(ulong)(uint)this_00->elements[uVar8],(ulong)(uint)this_00->elements[uVar8],
                   pUVar1);
      }
      iVar9 = offsets->limit;
      iVar11 = local_78;
    }
    uVar3 = local_84._4_8_;
    offsets->contextLimit = offsets->contextLimit + iVar11;
    offsets->limit = iVar9 + iVar11;
    iVar6 = iVar6 + iVar11;
    if ((char)local_74 == '\0') {
      iVar6 = iVar9 + iVar11;
    }
    offsets->start = iVar6;
    umtx_lock_63((UMutex *)0x0);
    if ((((LocalPointer<icu_63::BreakIterator> *)(uVar3 + 0x58))->
        super_LocalPointerBase<icu_63::BreakIterator>).ptr == (BreakIterator *)0x0) {
      (((LocalPointer<icu_63::BreakIterator> *)(uVar3 + 0x58))->
      super_LocalPointerBase<icu_63::BreakIterator>).ptr = pBVar10;
      pBVar10 = (BreakIterator *)0x0;
    }
    if ((((LocalPointer<icu_63::UVector32> *)(uVar3 + 0x60))->
        super_LocalPointerBase<icu_63::UVector32>).ptr == (UVector32 *)0x0) {
      (((LocalPointer<icu_63::UVector32> *)(uVar3 + 0x60))->
      super_LocalPointerBase<icu_63::UVector32>).ptr = this_00;
      this_00 = (UVector32 *)0x0;
    }
    umtx_unlock_63((UMutex *)0x0);
    icu_63::UnicodeString::~UnicodeString(&local_70);
    if (this_00 == (UVector32 *)0x0) goto LAB_00293938;
  }
  (*(this_00->super_UObject)._vptr_UObject[1])(this_00);
LAB_00293938:
  if (pBVar10 != (BreakIterator *)0x0) {
    (*(pBVar10->super_UObject)._vptr_UObject[1])(pBVar10);
  }
  return;
}

Assistant:

void BreakTransliterator::handleTransliterate(Replaceable& text, UTransPosition& offsets,
                                                    UBool isIncremental ) const {

        UErrorCode status = U_ZERO_ERROR;
        LocalPointer<BreakIterator> bi;
        LocalPointer<UVector32> boundaries;

        {
            Mutex m;
            BreakTransliterator *nonConstThis = const_cast<BreakTransliterator *>(this);
            boundaries.moveFrom(nonConstThis->cachedBoundaries);
            bi.moveFrom(nonConstThis->cachedBI);
        }
        if (bi.isNull()) {
            bi.adoptInstead(BreakIterator::createWordInstance(Locale::getEnglish(), status));
        }
        if (boundaries.isNull()) {
            boundaries.adoptInstead(new UVector32(status));
        }

        if (bi.isNull() || boundaries.isNull() || U_FAILURE(status)) {
            return;
        }

        boundaries->removeAllElements();
        UnicodeString sText = replaceableAsString(text);
        bi->setText(sText);
        bi->preceding(offsets.start);

        // To make things much easier, we will stack the boundaries, and then insert at the end.
        // generally, we won't need too many, since we will be filtered.

        int32_t boundary;
        for(boundary = bi->next(); boundary != UBRK_DONE && boundary < offsets.limit; boundary = bi->next()) {
            if (boundary == 0) continue;
            // HACK: Check to see that preceeding item was a letter

            UChar32 cp = sText.char32At(boundary-1);
            int type = u_charType(cp);
            //System.out.println(Integer.toString(cp,16) + " (before): " + type);
            if ((U_MASK(type) & (U_GC_L_MASK | U_GC_M_MASK)) == 0) continue;

            cp = sText.char32At(boundary);
            type = u_charType(cp);
            //System.out.println(Integer.toString(cp,16) + " (after): " + type);
            if ((U_MASK(type) & (U_GC_L_MASK | U_GC_M_MASK)) == 0) continue;

            boundaries->addElement(boundary, status);
            // printf("Boundary at %d\n", boundary);
        }

        int delta = 0;
        int lastBoundary = 0;

        if (boundaries->size() != 0) { // if we found something, adjust
            delta = boundaries->size() * fInsertion.length();
            lastBoundary = boundaries->lastElementi();

            // we do this from the end backwards, so that we don't have to keep updating.

            while (boundaries->size() > 0) {
                boundary = boundaries->popi();
                text.handleReplaceBetween(boundary, boundary, fInsertion);
            }
        }

        // Now fix up the return values
        offsets.contextLimit += delta;
        offsets.limit += delta;
        offsets.start = isIncremental ? lastBoundary + delta : offsets.limit;

        // Return break iterator & boundaries vector to the cache.
        {
            Mutex m;
            BreakTransliterator *nonConstThis = const_cast<BreakTransliterator *>(this);
            if (nonConstThis->cachedBI.isNull()) {
                nonConstThis->cachedBI.moveFrom(bi);
            }
            if (nonConstThis->cachedBoundaries.isNull()) {
                nonConstThis->cachedBoundaries.moveFrom(boundaries);
            }
        }

        // TODO:  do something with U_FAILURE(status);
        //        (need to look at transliterators overall, not just here.)
}